

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O2

iterator * __thiscall
obs::safe_list<obs::slot<void_()>_>::end
          (iterator *__return_storage_ptr__,safe_list<obs::slot<void_()>_> *this)

{
  std::mutex::lock(&this->m_mutex_nodes);
  iterator::iterator(__return_storage_ptr__,this,this->m_last);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return __return_storage_ptr__;
}

Assistant:

iterator end() {
    std::lock_guard<std::mutex> lock(m_mutex_nodes);
    return iterator(*this, m_last);
  }